

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O0

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
duckdb::
DateTruncStatistics<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::MillenniumOperator>
          (vector<duckdb::BaseStatistics,_true> *child_stats)

{
  bool bVar1;
  ulong uVar2;
  LogicalType *pLVar3;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> in_RDI;
  BaseStatistics result;
  Value max_value;
  Value min_value;
  timestamp_t max_part;
  timestamp_t min_part;
  timestamp_t max;
  timestamp_t min;
  value_type *nstats;
  nullptr_t in_stack_fffffffffffffe88;
  vector<duckdb::BaseStatistics,_true> *in_stack_fffffffffffffe90;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> input;
  LogicalType local_158 [24];
  BaseStatistics local_140 [40];
  BaseStatistics *in_stack_fffffffffffffee8;
  Value local_d0 [64];
  int64_t local_90;
  Value local_88 [64];
  int64_t local_48;
  int64_t local_40;
  int64_t local_38;
  int64_t local_30;
  timestamp_t local_28;
  timestamp_t local_20;
  reference local_18;
  
  input._M_head_impl =
       (BaseStatistics *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
       .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
  local_18 = vector<duckdb::BaseStatistics,_true>::operator[]
                       (in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
  uVar2 = duckdb::NumericStats::HasMinMax(local_18);
  if ((uVar2 & 1) == 0) {
    unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
    unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
              ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  }
  else {
    local_20 = NumericStats::GetMin<duckdb::timestamp_t>(in_stack_fffffffffffffee8);
    local_28 = NumericStats::GetMax<duckdb::timestamp_t>(in_stack_fffffffffffffee8);
    bVar1 = timestamp_t::operator>(&local_20,&local_28);
    if (bVar1) {
      unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>::
      unique_ptr<std::default_delete<duckdb::BaseStatistics>,void>
                ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
    else {
      local_38 = local_20.value;
      local_30 = (int64_t)DateTrunc::
                          UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::MillenniumOperator>
                                    ((timestamp_t)input._M_head_impl);
      local_48 = local_28.value;
      local_40 = (int64_t)DateTrunc::
                          UnaryFunction<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::DateTrunc::MillenniumOperator>
                                    ((timestamp_t)input._M_head_impl);
      local_90 = local_30;
      duckdb::Value::CreateValue<duckdb::timestamp_t>((timestamp_t)local_88);
      duckdb::Value::CreateValue<duckdb::timestamp_t>((timestamp_t)local_d0);
      pLVar3 = Value::type(local_88);
      duckdb::LogicalType::LogicalType(local_158,pLVar3);
      duckdb::NumericStats::CreateEmpty(local_140,local_158);
      duckdb::LogicalType::~LogicalType(local_158);
      duckdb::NumericStats::SetMin(local_140,local_88);
      duckdb::NumericStats::SetMax(local_140,local_d0);
      vector<duckdb::BaseStatistics,_true>::operator[]
                (in_stack_fffffffffffffe90,(size_type)in_stack_fffffffffffffe88);
      duckdb::BaseStatistics::CopyValidity(local_140);
      duckdb::BaseStatistics::ToUnique();
      duckdb::BaseStatistics::~BaseStatistics(local_140);
      duckdb::Value::~Value(local_d0);
      duckdb::Value::~Value(local_88);
    }
  }
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<BaseStatistics> DateTruncStatistics(vector<BaseStatistics> &child_stats) {
	// we can only propagate date stats if the child has stats
	auto &nstats = child_stats[1];
	if (!NumericStats::HasMinMax(nstats)) {
		return nullptr;
	}
	// run the operator on both the min and the max, this gives us the [min, max] bound
	auto min = NumericStats::GetMin<TA>(nstats);
	auto max = NumericStats::GetMax<TA>(nstats);
	if (min > max) {
		return nullptr;
	}

	// Infinite values are unmodified
	auto min_part = DateTrunc::UnaryFunction<TA, TR, OP>(min);
	auto max_part = DateTrunc::UnaryFunction<TA, TR, OP>(max);

	auto min_value = Value::CreateValue(min_part);
	auto max_value = Value::CreateValue(max_part);
	auto result = NumericStats::CreateEmpty(min_value.type());
	NumericStats::SetMin(result, min_value);
	NumericStats::SetMax(result, max_value);
	result.CopyValidity(child_stats[0]);
	return result.ToUnique();
}